

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O3

bool __thiscall mkvmuxer::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  Tag *pTVar6;
  long lVar7;
  
  iVar1 = this->tags_size_;
  if (this->tags_count_ < iVar1) {
    return true;
  }
  iVar4 = 1;
  if (iVar1 != 0) {
    iVar4 = iVar1 * 2;
  }
  lVar3 = (long)iVar4 * 0x10;
  uVar5 = 0xffffffffffffffff;
  if (-1 < iVar4) {
    uVar5 = lVar3 + 8;
  }
  plVar2 = (long *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
  if (plVar2 == (long *)0x0) {
    return false;
  }
  *plVar2 = (long)iVar4;
  lVar7 = 0;
  pTVar6 = (Tag *)(plVar2 + 1);
  do {
    Tag::Tag(pTVar6);
    lVar7 = lVar7 + -0x10;
    pTVar6 = pTVar6 + 1;
  } while (-lVar7 != lVar3);
  iVar1 = this->tags_count_;
  pTVar6 = this->tags_;
  if ((long)iVar1 < 1) {
    if (pTVar6 == (Tag *)0x0) goto LAB_0014d9e6;
  }
  else {
    lVar3 = 0;
    do {
      *(undefined8 *)((long)plVar2 + lVar3 + 8) =
           *(undefined8 *)((long)&pTVar6->simple_tags_ + lVar3);
      *(undefined8 *)((long)plVar2 + lVar3 + 0x10) =
           *(undefined8 *)((long)&pTVar6->simple_tags_size_ + lVar3);
      lVar3 = lVar3 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar3);
  }
  lVar3._0_4_ = pTVar6[-1].simple_tags_size_;
  lVar3._4_4_ = pTVar6[-1].simple_tags_count_;
  if (lVar3 != 0) {
    lVar3 = lVar3 << 4;
    do {
      Tag::~Tag((Tag *)((long)&pTVar6[-1].simple_tags_ + lVar3));
      lVar3 = lVar3 + -0x10;
    } while (lVar3 != 0);
  }
  operator_delete__(&pTVar6[-1].simple_tags_size_);
LAB_0014d9e6:
  this->tags_ = (Tag *)(plVar2 + 1);
  this->tags_size_ = iVar4;
  return true;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (tags_size_ > tags_count_)
    return true;  // nothing to do yet

  const int size = (tags_size_ == 0) ? 1 : 2 * tags_size_;

  Tag* const tags = new (std::nothrow) Tag[size];  // NOLINT
  if (tags == NULL)
    return false;

  for (int idx = 0; idx < tags_count_; ++idx) {
    const Tag& src = tags_[idx];
    Tag* const dst = tags + idx;
    src.ShallowCopy(dst);
  }

  delete[] tags_;

  tags_ = tags;
  tags_size_ = size;

  return true;
}